

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O0

bool __thiscall zmq::radix_tree_t::rm(radix_tree_t *this,uchar *key_,size_t key_size_)

{
  node_t node_;
  node_t node__00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  node_t nVar6;
  uchar *puVar7;
  uchar *puVar8;
  node_t *this_00;
  long in_RDX;
  undefined8 *in_RDI;
  node_t last_node;
  uchar last_byte;
  size_t last_index;
  uint32_t old_prefix_length_1;
  node_t other_child;
  uint32_t old_prefix_length;
  node_t child;
  size_t outgoing_edges;
  node_t grandparent_node;
  node_t parent_node;
  node_t current_node;
  size_t parent_edge_index;
  size_t edge_index;
  size_t prefix_bytes_matched;
  size_t key_bytes_matched;
  match_result_t match_result;
  node_t *in_stack_fffffffffffffe98;
  node_t in_stack_fffffffffffffea0;
  node_t *in_stack_fffffffffffffea8;
  uchar first_byte_;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  node_t *in_stack_fffffffffffffeb8;
  node_t in_stack_fffffffffffffec0;
  node_t local_c8;
  undefined8 local_c0;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  node_t in_stack_ffffffffffffff58;
  radix_tree_t *in_stack_ffffffffffffff60;
  node_t local_88;
  node_t local_80;
  undefined8 local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  undefined8 local_40;
  uchar *local_38;
  uchar *local_30;
  long local_20;
  bool local_1;
  
  local_20 = in_RDX;
  match(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58._data,
        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
        SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
  local_60 = local_58;
  local_68 = local_50;
  local_70 = local_48;
  local_78 = local_40;
  local_80._data = local_38;
  local_88._data = local_30;
  if (((local_58 == local_20) && (uVar2 = node_t::prefix_length(&local_80), local_50 == uVar2)) &&
     (uVar2 = node_t::refcount(&local_80), uVar2 != 0)) {
    uVar2 = node_t::refcount(&local_80);
    node_t::set_refcount(&local_80,uVar2 - 1);
    in_RDI[1] = in_RDI[1] + -1;
    uVar2 = node_t::refcount(&local_80);
    if (uVar2 == 0) {
      bVar1 = node_t::operator==(&local_80,(uchar *)*in_RDI);
      if (bVar1) {
        local_1 = true;
      }
      else {
        uVar2 = node_t::edgecount(&local_80);
        uVar5 = (ulong)uVar2;
        if (uVar5 < 2) {
          if (uVar5 == 1) {
            nVar6 = node_t::node_at(in_stack_fffffffffffffeb8,
                                    CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
            uVar2 = node_t::prefix_length(&local_80);
            node_t::prefix_length((node_t *)&stack0xffffffffffffff58);
            node_t::edgecount((node_t *)&stack0xffffffffffffff58);
            node_t::resize((node_t *)in_stack_fffffffffffffec0._data,
                           (size_t)in_stack_fffffffffffffeb8,
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
            puVar7 = node_t::prefix(&local_80);
            puVar8 = node_t::prefix((node_t *)&stack0xffffffffffffff58);
            uVar3 = node_t::prefix_length((node_t *)&stack0xffffffffffffff58);
            memcpy(puVar7 + uVar2,puVar8,(ulong)uVar3);
            node_t::first_bytes((node_t *)in_stack_fffffffffffffea0._data);
            node_t::set_first_bytes
                      ((node_t *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (uchar *)in_stack_fffffffffffffea8);
            node_t::node_pointers
                      ((node_t *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
            node_t::set_node_pointers
                      ((node_t *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (uchar *)in_stack_fffffffffffffea8);
            uVar2 = node_t::refcount((node_t *)&stack0xffffffffffffff58);
            node_t::set_refcount(&local_80,uVar2);
            free(nVar6._data);
            node_._data._4_4_ = in_stack_fffffffffffffeb4;
            node_._data._0_4_ = in_stack_fffffffffffffeb0;
            node_t::set_node_at(in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0._data,
                                node_);
            local_1 = true;
          }
          else {
            uVar2 = node_t::edgecount(&local_88);
            if ((uVar2 == 2) && (uVar2 = node_t::refcount(&local_88), uVar2 == 0)) {
              local_c0 = *in_RDI;
              bVar1 = node_t::operator!=(in_stack_fffffffffffffe98,in_stack_fffffffffffffea0);
              if (bVar1) {
                if (1 < local_70) {
                  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","edge_index < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radix_tree.cpp"
                          ,0x1d7);
                  fflush(_stderr);
                  zmq_abort((char *)0x30d933);
                }
                local_c8 = node_t::node_at(in_stack_fffffffffffffeb8,
                                           CONCAT44(in_stack_fffffffffffffeb4,
                                                    in_stack_fffffffffffffeb0));
                uVar3 = node_t::prefix_length(&local_88);
                uVar2 = uVar3;
                uVar4 = node_t::prefix_length(&local_c8);
                uVar5 = (ulong)(uVar2 + uVar4);
                node_t::edgecount(&local_c8);
                node_t::resize((node_t *)in_stack_fffffffffffffec0._data,uVar5,
                               CONCAT44(uVar2,in_stack_fffffffffffffeb0));
                puVar7 = node_t::prefix(&local_88);
                puVar7 = puVar7 + uVar3;
                puVar8 = node_t::prefix(&local_c8);
                uVar3 = node_t::prefix_length(&local_c8);
                memcpy(puVar7,puVar8,(ulong)uVar3);
                node_t::first_bytes((node_t *)in_stack_fffffffffffffea0._data);
                node_t::set_first_bytes
                          ((node_t *)CONCAT44(uVar2,in_stack_fffffffffffffeb0),
                           (uchar *)in_stack_fffffffffffffea8);
                node_t::node_pointers((node_t *)CONCAT44(uVar2,in_stack_fffffffffffffeb0));
                node_t::set_node_pointers
                          ((node_t *)CONCAT44(uVar2,in_stack_fffffffffffffeb0),
                           (uchar *)in_stack_fffffffffffffea8);
                uVar3 = node_t::refcount(&local_c8);
                node_t::set_refcount(&local_88,uVar3);
                free(local_80._data);
                free(local_c8._data);
                nVar6._data._4_4_ = uVar2;
                nVar6._data._0_4_ = in_stack_fffffffffffffeb0;
                node_t::set_node_at(in_stack_fffffffffffffea8,
                                    (size_t)in_stack_fffffffffffffea0._data,nVar6);
                return true;
              }
            }
            if (uVar5 != 0) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","outgoing_edges == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radix_tree.cpp"
                      ,499);
              fflush(_stderr);
              zmq_abort((char *)0x30db12);
            }
            node_t::edgecount(&local_88);
            node_t::first_byte_at
                      ((node_t *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (size_t)in_stack_fffffffffffffea8);
            first_byte_ = (uchar)((ulong)in_stack_fffffffffffffea8 >> 0x38);
            node_t::node_at(in_stack_fffffffffffffeb8,
                            CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
            node_t::set_edge_at(in_stack_fffffffffffffeb8,
                                CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                first_byte_,in_stack_fffffffffffffec0);
            puVar7 = node_t::node_pointers
                               ((node_t *)
                                CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
            puVar7 = puVar7 + -1;
            puVar8 = node_t::node_pointers
                               ((node_t *)
                                CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
            uVar2 = node_t::edgecount(&local_88);
            memmove(puVar7,puVar8,(ulong)uVar2 << 3);
            uVar2 = node_t::prefix_length(&local_88);
            this_00 = (node_t *)(ulong)uVar2;
            node_t::edgecount(&local_88);
            node_t::resize((node_t *)in_stack_fffffffffffffec0._data,
                           (size_t)in_stack_fffffffffffffeb8,
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
            free(local_80._data);
            uVar2 = node_t::prefix_length(&local_88);
            if (uVar2 == 0) {
              *in_RDI = local_88._data;
            }
            else {
              node__00._data._4_4_ = in_stack_fffffffffffffeb4;
              node__00._data._0_4_ = in_stack_fffffffffffffeb0;
              node_t::set_node_at(this_00,(size_t)puVar8,node__00);
            }
            local_1 = true;
          }
        }
        else {
          local_1 = true;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool zmq::radix_tree_t::rm (const unsigned char *key_, size_t key_size_)
{
    const match_result_t match_result = match (key_, key_size_);
    const size_t key_bytes_matched = match_result._key_bytes_matched;
    const size_t prefix_bytes_matched = match_result._prefix_bytes_matched;
    const size_t edge_index = match_result._edge_index;
    const size_t parent_edge_index = match_result._parent_edge_index;
    node_t current_node = match_result._current_node;
    node_t parent_node = match_result._parent_node;
    node_t grandparent_node = match_result._grandparent_node;

    if (key_bytes_matched != key_size_
        || prefix_bytes_matched != current_node.prefix_length ()
        || current_node.refcount () == 0)
        return false;

    current_node.set_refcount (current_node.refcount () - 1);
    --_size;
    if (current_node.refcount () > 0)
        return false;

    // Don't delete the root node.
    if (current_node == _root)
        return true;

    const size_t outgoing_edges = current_node.edgecount ();
    if (outgoing_edges > 1)
        // This node can't be merged with any other node, so there's
        // nothing more to do.
        return true;

    if (outgoing_edges == 1) {
        // Merge this node with the single child node.
        node_t child = current_node.node_at (0);

        // Make room for the child node's prefix and edges. We need to
        // keep the old prefix length since resize() will overwrite
        // it.
        const uint32_t old_prefix_length = current_node.prefix_length ();
        current_node.resize (old_prefix_length + child.prefix_length (),
                             child.edgecount ());

        // Append the child node's prefix to the current node.
        memcpy (current_node.prefix () + old_prefix_length, child.prefix (),
                child.prefix_length ());

        // Copy the rest of child node's data to the current node.
        current_node.set_first_bytes (child.first_bytes ());
        current_node.set_node_pointers (child.node_pointers ());
        current_node.set_refcount (child.refcount ());

        free (child._data);
        parent_node.set_node_at (edge_index, current_node);
        return true;
    }

    if (parent_node.edgecount () == 2 && parent_node.refcount () == 0
        && parent_node != _root) {
        // Removing this node leaves the parent with one child.
        // If the parent doesn't hold a key or if it isn't the root,
        // we can merge it with its single child node.
        zmq_assert (edge_index < 2);
        node_t other_child = parent_node.node_at (!edge_index);

        // Make room for the child node's prefix and edges. We need to
        // keep the old prefix length since resize() will overwrite
        // it.
        const uint32_t old_prefix_length = parent_node.prefix_length ();
        parent_node.resize (old_prefix_length + other_child.prefix_length (),
                            other_child.edgecount ());

        // Append the child node's prefix to the current node.
        memcpy (parent_node.prefix () + old_prefix_length,
                other_child.prefix (), other_child.prefix_length ());

        // Copy the rest of child node's data to the current node.
        parent_node.set_first_bytes (other_child.first_bytes ());
        parent_node.set_node_pointers (other_child.node_pointers ());
        parent_node.set_refcount (other_child.refcount ());

        free (current_node._data);
        free (other_child._data);
        grandparent_node.set_node_at (parent_edge_index, parent_node);
        return true;
    }

    // This is a leaf node that doesn't leave its parent with one
    // outgoing edge. Remove the outgoing edge to this node from the
    // parent.
    zmq_assert (outgoing_edges == 0);

    // Replace the edge to the current node with the last edge. An
    // edge consists of a byte and a pointer to the next node. First
    // replace the byte.
    const size_t last_index = parent_node.edgecount () - 1;
    const unsigned char last_byte = parent_node.first_byte_at (last_index);
    const node_t last_node = parent_node.node_at (last_index);
    parent_node.set_edge_at (edge_index, last_byte, last_node);

    // Move the chunk of pointers one byte to the left, effectively
    // deleting the last byte in the region of first bytes by
    // overwriting it.
    memmove (parent_node.node_pointers () - 1, parent_node.node_pointers (),
             parent_node.edgecount () * sizeof (void *));

    // Shrink the parent node to the new size, which "deletes" the
    // last pointer in the chunk of node pointers.
    parent_node.resize (parent_node.prefix_length (),
                        parent_node.edgecount () - 1);

    // Nothing points to this node now, so we can reclaim it.
    free (current_node._data);

    if (parent_node.prefix_length () == 0)
        _root._data = parent_node._data;
    else
        grandparent_node.set_node_at (parent_edge_index, parent_node);
    return true;
}